

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

void depspawn::wait_for_subtasks(bool priority)

{
  Workitem *pWVar1;
  Workitem *pWVar2;
  Workitem *extraout_RDX;
  Workitem *last_datain;
  long in_FS_OFFSET;
  Observer o;
  Observer local_18;
  
  local_18.limit_ = *(Workitem **)(in_FS_OFFSET + -8);
  if (local_18.limit_ == (Workitem *)0x0) {
    if (internal::TP != (TaskPool *)0x0) {
      local_18.cur_father_ = (Workitem *)0x10dfb7;
      internal::TaskPool::wait(internal::TP,(void *)0x0);
      pWVar1 = (anonymous_namespace)::worklist;
      last_datain = extraout_RDX;
      if ((anonymous_namespace)::worklist != (Workitem *)0x0) {
        while (pWVar2 = pWVar1, pWVar2 != (Workitem *)0x0) {
          last_datain = pWVar2;
          pWVar1 = pWVar2->next;
        }
        local_18.cur_father_ = (Workitem *)0x10dff0;
        LinkedListPool<depspawn::internal::Workitem,_true,_false>::freeLinkedList
                  ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                   internal::Workitem::Pool,(anonymous_namespace)::worklist,last_datain,false);
      }
      LOCK();
      (anonymous_namespace)::worklist = (Workitem *)0x0;
      UNLOCK();
    }
    return;
  }
  local_18.priority_ = priority;
  local_18.cur_father_ = local_18.limit_;
  Observer::~Observer(&local_18);
  return;
}

Assistant:

void wait_for_subtasks(bool priority)
  {
    internal::Workitem * cur_father = enum_thr_spec_father;
    
    //fprintf(stderr, "WFS %s\n", (cur_father == nullptr) ? "0" : "nested");
    
    if (cur_father == nullptr) {
      wait_for_all();
    } else {
      Observer o(priority, cur_father);
    }
  }